

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ps2.cpp
# Opt level: O3

uint32 * rw::ps2::instanceNormal(uint32 *wp,Geometry *g,Mesh *m,uint32 idx,uint32 n)

{
  ushort uVar1;
  V3d *pVVar2;
  ulong uVar3;
  uint uVar4;
  
  uVar4 = n + idx;
  if ((g->flags & 0x10) == 0) {
    if (idx < uVar4) {
      memset(wp,0,(ulong)(n - 1) * 3 + 3);
      wp = (uint32 *)((long)wp + (ulong)(n - 1) * 3 + 3);
    }
  }
  else if (idx < uVar4) {
    pVVar2 = g->morphTargets->normals;
    uVar3 = (ulong)idx;
    do {
      uVar1 = m->indices[uVar3];
      *(char *)wp = (char)(int)((float)pVVar2[uVar1].x * 127.0);
      *(char *)((long)wp + 1) = (char)(int)((float)pVVar2[uVar1].y * 127.0);
      *(char *)((long)wp + 2) = (char)(int)((float)pVVar2[uVar1].z * 127.0);
      wp = (uint32 *)((long)wp + 3);
      uVar3 = uVar3 + 1;
    } while (uVar4 != uVar3);
  }
  if (((ulong)wp & 0xf) != 0) {
    uVar3 = (ulong)((uint)wp & 0xf);
    memset(wp,0,0x10 - uVar3);
    wp = (uint32 *)((long)wp + (0x10 - uVar3));
  }
  return wp;
}

Assistant:

uint32*
instanceNormal(uint32 *wp, Geometry *g, Mesh *m, uint32 idx, uint32 n)
{
	uint16 j;
	V3d *d = g->morphTargets[0].normals;
	uint8 *p = (uint8*)wp;
	if((g->flags & Geometry::NORMALS))
		for(uint32 i = idx; i < idx+n; i++){
			j = m->indices[i];
			*p++ = d[j].x*127.0f;
			*p++ = d[j].y*127.0f;
			*p++ = d[j].z*127.0f;
		}
	else
		for(uint32 i = idx; i < idx+n; i++){
			*p++ = 0;
			*p++ = 0;
			*p++ = 0;
		}
	while((uintptr)p % 0x10)
		*p++ = 0;
	return (uint32*)p;
}